

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Float32_To_Int24_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  int iVar1;
  float fVar2;
  double dithered;
  double dither;
  undefined1 *puStack_40;
  PaInt32 temp;
  uchar *dest;
  float *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  puStack_40 = (undefined1 *)destinationBuffer;
  dest = (uchar *)sourceBuffer;
  ditherGenerator_local._0_4_ = count;
  while ((uint)ditherGenerator_local != 0) {
    fVar2 = PaUtil_GenerateFloatTriangularDither(ditherGenerator);
    iVar1 = (int)(*(float *)dest * 2.1474836e+09 + fVar2);
    *puStack_40 = (char)((uint)iVar1 >> 8);
    puStack_40[1] = (char)((uint)iVar1 >> 0x10);
    puStack_40[2] = (char)((uint)iVar1 >> 0x18);
    dest = dest + (long)sourceStride * 4;
    puStack_40 = puStack_40 + destinationStride * 3;
    ditherGenerator_local._0_4_ = (uint)ditherGenerator_local - 1;
  }
  return;
}

Assistant:

static void Float32_To_Int24_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    PaInt32 temp;

    while( count-- )
    {
        /* convert to 32 bit and drop the low 8 bits */

        double dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        double dithered = ((double)*src * (2147483646.0)) + dither;
        
        temp = (PaInt32) dithered;

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = (unsigned char)(temp >> 8);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 24);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(temp >> 24);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 8);
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}